

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_rec rf_image_alpha_border(rf_image image,float threshold)

{
  rf_source_location source_location;
  rf_color rVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 in_R9;
  uint uVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  float fVar10;
  float fVar11;
  undefined8 uVar12;
  rf_rec rVar13;
  uint local_88;
  uint local_84;
  long local_80;
  
  uVar3 = image.format - RF_UNCOMPRESSED_GRAYSCALE;
  if (uVar3 < 10) {
    if (uVar3 < 10) {
      local_80 = *(long *)(&DAT_0017bfa8 + (ulong)uVar3 * 8);
    }
    else {
      local_80 = 0;
    }
    if ((long)image.height < 1) {
      uVar7 = 0x10000;
      iVar2 = 1;
      iVar4 = 1;
      uVar3 = 0x10000;
    }
    else {
      lVar9 = 0;
      uVar3 = 0x10000;
      local_88 = 0;
      uVar7 = 0x10000;
      local_84 = 0;
      uVar5 = 0;
      do {
        if (0 < image.width) {
          uVar6 = 0;
          lVar8 = lVar9;
          do {
            rVar1 = rf_format_one_pixel_to_rgba32
                              ((void *)((lVar8 >> 0x20) + (long)image.data),image.format);
            if (((int)(threshold * 255.0) & 0xffU) < (uint)rVar1 >> 0x18) {
              if ((long)uVar6 < (long)(int)uVar3) {
                uVar3 = (uint)uVar6;
              }
              if (local_88 < uVar6) {
                local_88 = (uint)uVar6;
              }
              if ((long)uVar5 < (long)(int)uVar7) {
                uVar7 = (uint)uVar5;
              }
              if (local_84 < uVar5) {
                local_84 = (uint)uVar5;
              }
            }
            uVar6 = uVar6 + 1;
            lVar8 = lVar8 + local_80;
          } while ((long)image.width != uVar6);
        }
        uVar5 = uVar5 + 1;
        lVar9 = lVar9 + local_80 * image.width;
      } while (uVar5 != (long)image.height);
      iVar4 = local_88 + 1;
      iVar2 = local_84 + 1;
    }
    fVar10 = (float)(int)uVar3;
    fVar11 = (float)(int)uVar7;
    uVar12 = CONCAT44((float)(int)(iVar2 - uVar7),(float)(int)(iVar4 - uVar3));
  }
  else {
    source_location.proc_name._0_4_ = 0x17ca9b;
    source_location.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location.proc_name._4_4_ = 0;
    source_location.line_in_file = 0x3c36;
    rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                "Function only works for uncompressed formats but was called with format %d.",1,
                (ulong)image.format,(ulong)image.format,in_R9);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_image_alpha_border";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3c36;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
    fVar10 = 0.0;
    fVar11 = 0.0;
    uVar12 = 0;
  }
  rVar13.y = fVar11;
  rVar13.x = fVar10;
  rVar13.width = (float)(int)uVar12;
  rVar13.height = (float)(int)((ulong)uVar12 >> 0x20);
  return rVar13;
}

Assistant:

RF_API rf_rec rf_image_alpha_border(rf_image image, float threshold)
{
    rf_rec crop = {0};

    if (rf_is_uncompressed_format(image.format))
    {
        int x_min = 65536; // Define a big enough number
        int x_max = 0;
        int y_min = 65536;
        int y_max = 0;

        int src_bpp = rf_bytes_per_pixel(image.format);
        int src_size = rf_image_size(image);
        unsigned char* src = image.data;

        for (rf_int y = 0; y < image.height; y++)
        {
            for (rf_int x = 0; x < image.width; x++)
            {
                int src_pos = (y * image.width + x) * src_bpp;

                rf_color rgba32_pixel = rf_format_one_pixel_to_rgba32(&src[src_pos], image.format);

                if (rgba32_pixel.a > (unsigned char)(threshold * 255.0f))
                {
                    if (x < x_min) x_min = x;
                    if (x > x_max) x_max = x;
                    if (y < y_min) y_min = y;
                    if (y > y_max) y_max = y;
                }
            }
        }

        crop = (rf_rec) { x_min, y_min, (x_max + 1) - x_min, (y_max + 1) - y_min };
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Function only works for uncompressed formats but was called with format %d.", image.format);

    return crop;
}